

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_glows.cxx
# Opt level: O1

void __thiscall xray_re::xr_glow_object::save(xr_glow_object *this,xr_writer *w)

{
  float local_1c;
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_raw_chunk(w,0xc411,&GLOW_VERSION,2,false);
  xr_writer::open_chunk(w,0xc413);
  local_1c = this->m_radius;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0xc414);
  xr_writer::w_sz(w,&this->m_shader);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0xc415);
  xr_writer::w_sz(w,&this->m_texture);
  xr_writer::close_chunk(w);
  xr_writer::w_raw_chunk(w,0xc416,&this->m_flags,2,false);
  return;
}

Assistant:

void xr_glow_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);

	w.w_chunk<uint16_t>(GLOW_CHUNK_VERSION, GLOW_VERSION);

	w.open_chunk(GLOW_CHUNK_PARAMS);
	w.w_float(m_radius);
	w.close_chunk();

	w.w_chunk(GLOW_CHUNK_SHADER, m_shader);
	w.w_chunk(GLOW_CHUNK_TEXTURE, m_texture);

	w.w_chunk<uint16_t>(GLOW_CHUNK_FLAGS, m_flags);
}